

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O3

string * __thiscall
ctemplate::TemplateCache::template_root_directory_abi_cxx11_
          (string *__return_storage_ptr__,TemplateCache *this)

{
  int iVar1;
  Mutex *pMVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer pcVar5;
  size_t sVar6;
  
  pMVar2 = this->search_path_mutex_;
  iVar1 = pMVar2->mutex_;
  pMVar2->mutex_ = iVar1 + 1;
  if (iVar1 < 0) {
    __assert_fail("++mutex_ > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                  ,0xef,"void ctemplate::Mutex::ReaderLock()");
  }
  pbVar3 = (this->search_path_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (this->search_path_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (pbVar3 == pbVar4) {
    sVar6 = strlen("./");
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,&kCWD,(long)&kCWD + sVar6);
  }
  else {
    pcVar5 = (pbVar3->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar5,pcVar5 + pbVar3->_M_string_length);
  }
  iVar1 = pMVar2->mutex_;
  pMVar2->mutex_ = iVar1 + -1;
  if (0 < iVar1) {
    return __return_storage_ptr__;
  }
  __assert_fail("mutex_-- > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                ,0xf0,"void ctemplate::Mutex::ReaderUnlock()");
}

Assistant:

string TemplateCache::template_root_directory() const {
  ReaderMutexLock ml(search_path_mutex_);
  if (search_path_.empty()) {
    return kCWD;
  }
  return search_path_[0];
}